

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O2

void Qiniu_Rio_doTask(void *params)

{
  uint blkIdx;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  _Qiniu_Uploading_Parts_Progress *progress;
  _func_void_size_t_size_t *p_Var7;
  long lVar8;
  Qiniu_Writer w;
  Qiniu_Writer w_00;
  Qiniu_ReaderAt r;
  Qiniu_ReaderAt r_00;
  uint code;
  Qiniu_Retry_Decision QVar9;
  int iVar10;
  Qiniu_Client *self;
  long off;
  char *pcVar11;
  cJSON *object;
  cJSON *pcVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  Qiniu_Reader QVar19;
  Qiniu_Error QVar20;
  long local_178;
  Qiniu_Rio_BlkputRet ret;
  long *local_110;
  ulong local_108;
  Qiniu_Crc32 crc32;
  _Qiniu_Progress_Callback_Data_conflict local_b8;
  Qiniu_Writer h;
  Qiniu_Section section;
  Qiniu_Tee tee;
  
  uVar3 = *(undefined8 *)((long)params + 0x20);
  lVar4 = *(long *)((long)params + 0x28);
  lVar5 = *(long *)((long)params + 0x18);
  plVar6 = *(long **)((long)params + 0x30);
  self = (Qiniu_Client *)
         (**(code **)(*(long *)(lVar5 + 0x40) + 8))
                   (*(undefined8 *)(lVar5 + 0x38),*(undefined8 *)((long)params + 0x10));
  if (0 < **(long **)((long)params + 0x40)) {
    free(params);
    Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
    (**(code **)(lVar4 + 8))(uVar3);
    return;
  }
  blkIdx = *(uint *)((long)params + 0x48);
  iVar17 = *(int *)(lVar5 + 0xc);
  ret.host = (char *)0x0;
  ret.economical = 0;
  ret._44_4_ = 0;
  ret.crc32 = 0;
  ret.offset = 0;
  ret.expiredAt = 0;
  ret.ctx = (char *)0x0;
  ret.checksum = (char *)0x0;
  lVar15 = (long)(int)blkIdx * 0x30;
  off = (long)(int)blkIdx * 0x400000;
  do {
    Qiniu_Rio_BlkputRet_Assign(&ret,(Qiniu_Rio_BlkputRet *)(*(long *)(lVar5 + 0x28) + lVar15));
    pcVar13 = Qiniu_OK.message;
    code = Qiniu_OK.code;
    uVar1 = *(uint *)((long)params + 0x4c);
    iVar10 = *(int *)((long)params + 0x50);
    progress = *(_Qiniu_Uploading_Parts_Progress **)((long)params + 0x58);
    r_00 = *params;
    r = *params;
    Qiniu_Crc32Writer(&h,&crc32,0);
    uVar2 = *(uint *)(lVar5 + 8);
    local_b8.callback = (_func_void_size_t_size_t *)0x0;
    local_b8._16_8_ = 0;
    local_b8.progress = (_Qiniu_Uploading_Parts_Progress *)0x0;
    local_b8.totalSize = 0;
    local_b8.previousUlNow = 0;
    p_Var7 = *(_func_void_size_t_size_t **)(lVar5 + 0x90);
    if (p_Var7 != (_func_void_size_t_size_t *)0x0) {
      local_b8._20_4_ = 0;
      local_b8.blkIdx = blkIdx;
      local_b8.totalSize = (long)iVar10;
      local_b8.progress = progress;
      local_b8.callback = p_Var7;
    }
    local_108 = 1;
    local_110 = (long *)(lVar5 + 0x78);
    if (*(long *)(lVar5 + 0x78) == 0) {
      local_110 = *(long **)(lVar5 + 0x80);
      local_108 = *(ulong *)(lVar5 + 0x88);
    }
    if (ret.ctx != (char *)0x0) {
      if (p_Var7 != (_func_void_size_t_size_t *)0x0) {
        uVar16 = (ulong)ret._16_8_ >> 0x20;
        local_178 = 0;
        goto LAB_00117010;
      }
      local_178 = 0;
LAB_00117208:
      uVar14 = uVar1 - ret.offset;
      if (uVar14 != 0 && (int)ret.offset <= (int)uVar1) {
        if ((int)uVar2 < (int)uVar14) {
          uVar14 = uVar2;
        }
        uVar16 = self->hostsRetriesMax + 1;
        iVar10 = (int)uVar16;
        if ((ulong)(long)*(int *)(lVar5 + 0xc) <= uVar16) {
          iVar10 = *(int *)(lVar5 + 0xc);
        }
        uVar16 = (ulong)(int)uVar14;
        uVar18 = (ulong)iVar10;
        do {
          crc32.val = 0;
          QVar19 = Qiniu_SectionReader(&section,r_00,(ulong)ret.offset + off,uVar16);
          w_00.Write = h.Write;
          w_00.self = h.self;
          w_00.Flush = h.Flush;
          QVar19 = Qiniu_TeeReader(&tee,QVar19,w_00);
          pcVar11 = Qiniu_String_Format(0x400,"%s/bput/%s/%d",local_110[uVar18 % local_108],ret.ctx,
                                        (ulong)ret._16_8_ >> 0x20);
          QVar20 = Qiniu_Rio_bput(self,&ret,QVar19,uVar14,pcVar11,&local_b8);
          pcVar13 = QVar20.message;
          code = QVar20.code;
          Qiniu_Free(pcVar11);
          if (code == 200) {
            local_178 = local_178 + 1;
            if (crc32.val == (ret._16_8_ & 0xffffffff)) goto LAB_001173f3;
            Qiniu_Stderr_Warn("ResumableBlockput: invalid checksum, retry");
            code = 0x26ac;
            lVar8 = *(long *)(lVar5 + 0x90);
            pcVar13 = "unmatched checksum";
          }
          else {
            if (code == 0x2bd) {
              Qiniu_Rio_BlkputRet_Cleanup(&ret);
              Qiniu_Stderr_Warn("ResumableBlockput: invalid ctx, please retry");
              code = 0x2bd;
              pcVar11 = pcVar13;
              goto LAB_00117463;
            }
            Qiniu_Stderr_Warn("ResumableBlockput %d off:%d failed - %E",(ulong)blkIdx,
                              (ulong)ret._16_8_ >> 0x20,(ulong)code,pcVar13);
            lVar8 = *(long *)(lVar5 + 0x90);
          }
          if (lVar8 != 0) {
            _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
          }
          if (((long)uVar18 < 2) || (QVar9 = _Qiniu_Should_Retry(code), QVar9 == QINIU_DONT_RETRY))
          break;
          uVar18 = uVar18 - 1;
          Qiniu_Stderr_Info("ResumableBlockput %E, retrying ...",(ulong)code,pcVar13);
        } while( true );
      }
      goto LAB_00117174;
    }
    uVar14 = uVar1;
    if ((int)uVar2 < (int)uVar1) {
      uVar14 = uVar2;
    }
    uVar16 = 0;
    do {
      if (((long)*(int *)(lVar5 + 0xc) <= (long)uVar16) || (self->hostsRetriesMax < uVar16)) {
        if (code == 200) {
LAB_001171ac:
          code = 0x26ac;
          if (crc32.val != (ret._16_8_ & 0xffffffff)) {
            pcVar11 = "unmatched checksum";
            goto LAB_00117463;
          }
          pcVar11 = "unmatched checksum";
          if (ret.offset != uVar14) goto LAB_00117463;
          iVar10 = (**(code **)(lVar5 + 0x18))(*(undefined8 *)(lVar5 + 0x10),blkIdx,uVar1,&ret);
          code = 200;
          local_178 = 1;
          if (iVar10 != 1) goto LAB_00117208;
          goto LAB_001174dc;
        }
        break;
      }
      QVar19 = Qiniu_SectionReader(&section,r,off,(long)(int)uVar14);
      w.Write = h.Write;
      w.self = h.self;
      w.Flush = h.Flush;
      QVar19 = Qiniu_TeeReader(&tee,QVar19,w);
      pcVar11 = Qiniu_String_Format(0x80,"%s/mkblk/%d",local_110[uVar16 % local_108],(ulong)uVar1);
      QVar20 = Qiniu_Rio_bput(self,&ret,QVar19,uVar14,pcVar11,&local_b8);
      pcVar13 = QVar20.message;
      code = QVar20.code;
      Qiniu_Free(pcVar11);
      if (code == 200) {
        if (*(long *)(lVar5 + 0x90) != 0) {
          _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,(long)(int)uVar14);
        }
        goto LAB_001171ac;
      }
      if (*(long *)(lVar5 + 0x90) != 0) {
        _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
      }
      QVar9 = _Qiniu_Should_Retry(code);
      uVar16 = uVar16 + 1;
    } while (QVar9 != QINIU_DONT_RETRY);
    local_178 = 0;
LAB_00117174:
    if (code == 200) {
      Qiniu_Rio_BlkputRet_Assign((Qiniu_Rio_BlkputRet *)(lVar15 + *(long *)(lVar5 + 0x28)),&ret);
      if ((plVar6 != (long *)0x0 && local_178 != 0) && (lVar5 = *plVar6, lVar5 != 0)) {
        object = cJSON_CreateObject();
        pcVar12 = cJSON_CreateNumber((double)(int)blkIdx);
        cJSON_AddItemToObject(object,"blkIdx",pcVar12);
        pcVar12 = cJSON_CreateString(ret.ctx);
        cJSON_AddItemToObject(object,"ctx",pcVar12);
        pcVar12 = cJSON_CreateString(ret.checksum);
        cJSON_AddItemToObject(object,"checksum",pcVar12);
        pcVar12 = cJSON_CreateNumber((double)(ret._16_8_ & 0xffffffff));
        cJSON_AddItemToObject(object,"crc32",pcVar12);
        pcVar12 = cJSON_CreateNumber((double)((ulong)ret._16_8_ >> 0x20));
        cJSON_AddItemToObject(object,"offset",pcVar12);
        pcVar12 = cJSON_CreateNumber(((double)CONCAT44(0x45300000,(int)(ret.expiredAt >> 0x20)) -
                                     1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)ret.expiredAt) -
                                     4503599627370496.0));
        cJSON_AddItemToObject(object,"expiredAt",pcVar12);
        pcVar12 = cJSON_CreateString(ret.host);
        cJSON_AddItemToObject(object,"host",pcVar12);
        pcVar13 = cJSON_PrintUnformatted(object);
        cJSON_Delete(object);
        if (pcVar13 != (char *)0x0) {
          (**(code **)(lVar5 + 0x10))(lVar5,pcVar13,0);
          free(pcVar13);
        }
      }
      goto LAB_001174cd;
    }
    pcVar11 = pcVar13;
    if (code == 0x26af) {
LAB_001174dc:
      Qiniu_Rio_BlkputRet_Cleanup(&ret);
      Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
      goto LAB_001174f7;
    }
LAB_00117463:
    if ((iVar17 < 2) || (QVar9 = _Qiniu_Should_Retry(code), QVar9 == QINIU_DONT_RETRY)) {
      Qiniu_Stderr_Warn("resumable.Put %d failed: %E",(ulong)blkIdx,(ulong)code,pcVar11);
      (**(code **)(lVar5 + 0x20))
                (*(undefined8 *)(lVar5 + 0x10),*(undefined4 *)((long)params + 0x48),
                 *(undefined4 *)((long)params + 0x4c),code,pcVar11);
      **(int **)((long)params + 0x38) = **(int **)((long)params + 0x38) + 1;
LAB_001174cd:
      Qiniu_Rio_BlkputRet_Cleanup(&ret);
LAB_001174f7:
      free(params);
      (**(code **)(lVar4 + 8))(uVar3);
      return;
    }
    iVar17 = iVar17 + -1;
    Qiniu_Stderr_Info("resumable.Put %E, retrying ...",(ulong)code,pcVar11);
  } while( true );
LAB_001173f3:
  iVar10 = (**(code **)(lVar5 + 0x18))(*(undefined8 *)(lVar5 + 0x10),blkIdx,uVar1,&ret);
  if (iVar10 == 1) goto LAB_001174dc;
  code = 200;
  if (*(long *)(lVar5 + 0x90) != 0) {
LAB_00117010:
    _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,uVar16);
  }
  goto LAB_00117208;
}

Assistant:

static void Qiniu_Rio_doTask(void *params)
{
    Qiniu_Rio_BlkputRet ret;
    Qiniu_Rio_task *task = (Qiniu_Rio_task *)params;
    Qiniu_Rio_WaitGroup wg = task->wg;
    Qiniu_Rio_PutExtra *extra = task->extra;
    Qiniu_Rio_Recorder *recorder = task->recorder;
    Qiniu_Rio_ThreadModel tm = extra->threadModel;
    Qiniu_Client *c = tm.itbl->ClientTls(tm.self, task->mc);
    int blkIdx = task->blkIdx;
    int tryTimes = extra->tryTimes;
    size_t chunksUploaded = 0;

    if ((*task->ninterrupts) > 0)
    {
        free(task);
        Qiniu_Count_Inc(task->ninterrupts);
        wg.itbl->Done(wg.self);
        return;
    }

    memset(&ret, 0, sizeof(ret));

lzRetry:
    Qiniu_Rio_BlkputRet_Assign(&ret, &extra->progresses[blkIdx]);
    Qiniu_Error err = Qiniu_Rio_ResumableBlockput(c, &ret, task->f, blkIdx, task->blkSize1, task->fsize, task->progress, extra, &chunksUploaded);
    if (err.code != 200)
    {
        if (err.code == Qiniu_Rio_PutInterrupted)
        {
            // Terminate the upload process if the caller requests
            Qiniu_Rio_BlkputRet_Cleanup(&ret);
            Qiniu_Count_Inc(task->ninterrupts);
            free(task);
            wg.itbl->Done(wg.self);
            return;
        }

        if (tryTimes > 1 && _Qiniu_Should_Retry(err.code) != QINIU_DONT_RETRY)
        {
            tryTimes--;
            Qiniu_Log_Info("resumable.Put %E, retrying ...", err);
            goto lzRetry;
        }
        Qiniu_Log_Warn("resumable.Put %d failed: %E", blkIdx, err);
        extra->notifyErr(extra->notifyRecvr, task->blkIdx, task->blkSize1, err);
        (*task->nfails)++;
    }
    else
    {
        Qiniu_Rio_BlkputRet_Assign(&extra->progresses[blkIdx], &ret);
        if (chunksUploaded > 0 && recorder != NULL && recorder->recorderMedium != NULL)
        {
            Qiniu_Rio_Recorder_Write_Medium(recorder->recorderMedium, blkIdx, &ret);
        }
    }
    Qiniu_Rio_BlkputRet_Cleanup(&ret);
    free(task);
    wg.itbl->Done(wg.self);
}